

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O2

void saxpy(int n,float a,float *x,int incx,float *y,int incy)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((0 < n) && ((a != 0.0 || (NAN(a))))) {
    if (incy == 1 && incx == 1) {
      uVar1 = (ulong)(n & 3);
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        y[uVar4] = x[uVar4] * a + y[uVar4];
      }
      for (; uVar1 < (uint)n; uVar1 = uVar1 + 4) {
        y[uVar1] = x[uVar1] * a + y[uVar1];
        y[uVar1 + 1] = x[uVar1 + 1] * a + y[uVar1 + 1];
        y[uVar1 + 2] = x[uVar1 + 2] * a + y[uVar1 + 2];
        y[uVar1 + 3] = x[uVar1 + 3] * a + y[uVar1 + 3];
      }
    }
    else {
      pfVar2 = y + (incy >> 0x1f & (1 - n) * incy);
      pfVar3 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar5 = n != 0, n = n + -1, bVar5) {
        *pfVar2 = *pfVar3 * a + *pfVar2;
        pfVar2 = pfVar2 + incy;
        pfVar3 = pfVar3 + incx;
      }
    }
  }
  return;
}

Assistant:

void saxpy ( int n, float a, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SAXPY computes float constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in X and Y.
//
//    Input, float A, the multiplier of X.
//
//    Input, float X[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], the second vector.
//    On output, Y[*] has been replaced by Y[*] + A * X[*].
//
//    Input, int INCY, the increment between successive entries of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( a == 0.0 )
  {
    return;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      y[iy] = y[iy] + a * x[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 4;

    for ( i = 0; i < m; i++ )
    {
      y[i] = y[i] + a * x[i];
    }

    for ( i = m; i < n; i = i + 4 )
    {
      y[i  ] = y[i  ] + a * x[i  ];
      y[i+1] = y[i+1] + a * x[i+1];
      y[i+2] = y[i+2] + a * x[i+2];
      y[i+3] = y[i+3] + a * x[i+3];
    }
  }

  return;
}